

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Matcher::PushStats(Matcher *this,ContStack *contStack,Char *input)

{
  size_t sVar1;
  Cont *pCVar2;
  Char *input_local;
  ContStack *contStack_local;
  Matcher *this_local;
  
  if (this->stats != (Type)0x0) {
    this->stats->numPushes = this->stats->numPushes + 1;
    sVar1 = ContinuousPageStack<1UL>::Position((ContinuousPageStack<1UL> *)contStack);
    if (this->stats->stackHWM < sVar1) {
      sVar1 = ContinuousPageStack<1UL>::Position((ContinuousPageStack<1UL> *)contStack);
      this->stats->stackHWM = sVar1;
    }
  }
  if (this->w != (Type)0x0) {
    DebugWriter::Print(this->w,L"PUSH ");
    pCVar2 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    (**pCVar2->_vptr_Cont)(pCVar2,this->w,input);
  }
  return;
}

Assistant:

void Matcher::PushStats(ContStack& contStack, const Char* const input) const
    {
        if (stats != 0)
        {
            stats->numPushes++;
            if (contStack.Position() > stats->stackHWM)
                stats->stackHWM = contStack.Position();
        }
        if (w != 0)
        {
            w->Print(_u("PUSH "));
            contStack.Top()->Print(w, input);
        }
    }